

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastRotateRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,Vec_Int_t *vRes)

{
  int iVar1;
  int *pArray;
  int *pTemp;
  int j;
  int i;
  int *pRes;
  Vec_Int_t *vRes_local;
  int nShift_local;
  int *pShift_local;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  _j = Wlc_VecCopy(vRes,pNum,nNum);
  pArray = (int *)malloc((long)nNum << 2);
  if (0x20 < nShift) {
    __assert_fail("nShift <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0xe4,
                  "void Wlc_BlastRotateRight(Gia_Man_t *, int *, int, int *, int, Vec_Int_t *)");
  }
  pTemp._4_4_ = 0;
  while (pTemp._4_4_ < nShift) {
    for (pTemp._0_4_ = 0; (int)pTemp < nNum; pTemp._0_4_ = (int)pTemp + 1) {
      iVar1 = Gia_ManHashMux(pNew,pShift[pTemp._4_4_],
                             _j[((int)pTemp + (1 << ((byte)pTemp._4_4_ & 0x1f))) % nNum],
                             _j[(int)pTemp]);
      pArray[(int)pTemp] = iVar1;
    }
    pTemp._4_4_ = pTemp._4_4_ + 1;
    _j = Wlc_VecCopy(vRes,pArray,nNum);
  }
  if (pArray != (int *)0x0) {
    free(pArray);
  }
  return;
}

Assistant:

void Wlc_BlastRotateRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int i, j, * pTemp = ABC_ALLOC( int, nNum );
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++, pRes = Wlc_VecCopy(vRes, pTemp, nNum) ) 
        for( j = 0; j < nNum; j++ ) 
            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[(j+(1<<i))%nNum], pRes[j] );
    ABC_FREE( pTemp );
}